

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::RemoveLogSink(LogSink *destination)

{
  bool bVar1;
  pointer this;
  pointer pvVar2;
  __normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
  local_58;
  const_iterator local_50;
  LogSink **local_38;
  __normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
  local_30;
  __normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
  local_28;
  const_iterator local_20;
  lock_guard<std::shared_mutex> local_18;
  SinkLock l;
  LogSink *destination_local;
  
  l._M_device = (mutex_type *)destination;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_18,(mutex_type *)sink_mutex_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&sinks_);
  if (bVar1) {
    this = std::
           unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
           ::operator->((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                         *)&sinks_);
    pvVar2 = std::
             unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
             ::operator->((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                           *)&sinks_);
    local_30._M_current =
         (LogSink **)
         std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::begin(pvVar2);
    pvVar2 = std::
             unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
             ::operator->((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                           *)&sinks_);
    local_38 = (LogSink **)
               std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::end(pvVar2);
    local_28 = std::
               remove<__gnu_cxx::__normal_iterator<google::LogSink**,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>,google::LogSink*>
                         (local_30,(__normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                                    )local_38,(LogSink **)&l);
    __gnu_cxx::
    __normal_iterator<google::LogSink*const*,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>
    ::__normal_iterator<google::LogSink**>
              ((__normal_iterator<google::LogSink*const*,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>
                *)&local_20,&local_28);
    pvVar2 = std::
             unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
             ::operator->((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                           *)&sinks_);
    local_58._M_current =
         (LogSink **)std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::end(pvVar2)
    ;
    __gnu_cxx::
    __normal_iterator<google::LogSink*const*,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>
    ::__normal_iterator<google::LogSink**>
              ((__normal_iterator<google::LogSink*const*,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>
                *)&local_50,&local_58);
    std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::erase
              (this,local_20,local_50);
  }
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

inline void LogDestination::RemoveLogSink(LogSink* destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  SinkLock l{sink_mutex_};
  // This doesn't keep the sinks in order, but who cares?
  if (sinks_) {
    sinks_->erase(std::remove(sinks_->begin(), sinks_->end(), destination),
                  sinks_->end());
  }
}